

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_0::TestCase63::run(TestCase63 *this)

{
  ArrayPtr<const_kj::StringPtr> importPath_00;
  ArrayPtr<const_kj::StringPtr> importPath_01;
  ArrayPtr<const_kj::StringPtr> importPath_02;
  ArrayPtr<const_kj::StringPtr> importPath_03;
  ArrayPtr<const_kj::StringPtr> importPath_04;
  Field field;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  Field field_05;
  Field field_06;
  bool bVar1;
  uint uVar2;
  uint64_t uVar3;
  ParsedSchema PVar4;
  Reader RVar5;
  ArrayPtr<const_char> AVar6;
  undefined8 in_stack_ffffffffffffeca8;
  Reader local_fe8;
  ArrayPtr<const_char> local_fb8;
  bool local_fa1;
  undefined1 local_fa0 [7];
  bool _kj_shouldLog_20;
  ArrayPtr<const_char> local_f70;
  Reader local_f60;
  uint64_t local_f30;
  unsigned_long_long local_f28;
  bool local_f19;
  undefined1 local_f18 [7];
  bool _kj_shouldLog_19;
  StringPtr *local_ee8;
  size_t sStack_ee0;
  ArrayPtr<const_char> local_ed8;
  ArrayPtr<const_char> local_ec8;
  Schema local_eb8;
  ParsedSchema wrongGraultSchema;
  Schema local_e78;
  bool local_e69;
  undefined1 local_e68 [7];
  bool _kj_shouldLog_18;
  Schema local_e38;
  ArrayPtr<const_char> local_e30;
  ParsedSchema local_e20;
  Schema local_e10;
  StructSchema graultStruct;
  ArrayPtr<const_char> local_dd8;
  bool local_dc1;
  undefined1 local_dc0 [7];
  bool _kj_shouldLog_17;
  ArrayPtr<const_char> local_d90;
  Reader local_d80;
  uint64_t local_d50;
  unsigned_long_long local_d48;
  bool local_d39;
  undefined1 local_d38 [7];
  bool _kj_shouldLog_16;
  StringPtr *local_d08;
  size_t sStack_d00;
  ArrayPtr<const_char> local_cf8;
  ArrayPtr<const_char> local_ce8;
  undefined1 local_cd8 [8];
  ParsedSchema graultSchema;
  Schema local_c98;
  bool local_c89;
  undefined1 local_c88 [7];
  bool _kj_shouldLog_15;
  Schema local_c58;
  ArrayPtr<const_char> local_c50;
  ParsedSchema local_c40;
  Schema local_c30;
  StructSchema corgeStruct;
  ArrayPtr<const_char> local_bf8;
  bool local_be1;
  undefined1 local_be0 [7];
  bool _kj_shouldLog_14;
  ArrayPtr<const_char> local_bb0;
  Reader local_ba0;
  uint64_t local_b70;
  unsigned_long_long local_b68;
  bool local_b59;
  undefined1 local_b58 [7];
  bool _kj_shouldLog_13;
  StringPtr *local_b28;
  size_t sStack_b20;
  ArrayPtr<const_char> local_b18;
  ArrayPtr<const_char> local_b08;
  undefined1 local_af8 [8];
  ParsedSchema corgeSchema;
  Schema local_ab8;
  bool local_aa9;
  undefined1 local_aa8 [7];
  bool _kj_shouldLog_12;
  Schema local_a78;
  ArrayPtr<const_char> local_a70;
  ParsedSchema local_a60;
  Schema local_a50;
  StructSchema bazStruct;
  ArrayPtr<const_char> local_a18;
  bool local_a01;
  undefined1 local_a00 [7];
  bool _kj_shouldLog_11;
  ArrayPtr<const_char> local_9d0;
  Reader local_9c0;
  uint64_t local_990;
  unsigned_long_long local_988;
  bool local_979;
  undefined1 local_978 [7];
  bool _kj_shouldLog_10;
  StringPtr *local_948;
  size_t sStack_940;
  ArrayPtr<const_char> local_938;
  ArrayPtr<const_char> local_928;
  undefined1 local_918 [8];
  ParsedSchema bazSchema;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  uint64_t local_8c8;
  unsigned_long_long local_8c0;
  bool local_8b1;
  undefined1 auStack_8b0 [7];
  bool _kj_shouldLog_9;
  undefined8 uStack_8a8;
  SegmentReader *local_8a0;
  CapTableReader *pCStack_898;
  void *local_890;
  WirePointer *pWStack_888;
  undefined8 local_880;
  int iStack_878;
  undefined2 uStack_874;
  undefined2 uStack_872;
  Field local_870;
  Reader local_830;
  ArrayPtr<const_char> local_800;
  bool local_7e9;
  undefined1 local_7e8 [7];
  bool _kj_shouldLog_8;
  Reader local_7a8;
  ArrayPtr<const_char> local_778;
  Field local_768;
  uint64_t local_728;
  unsigned_long_long local_720;
  bool local_711;
  undefined1 auStack_710 [7];
  bool _kj_shouldLog_7;
  undefined8 uStack_708;
  SegmentReader *local_700;
  CapTableReader *pCStack_6f8;
  void *local_6f0;
  WirePointer *pWStack_6e8;
  undefined8 local_6e0;
  int iStack_6d8;
  undefined2 uStack_6d4;
  undefined2 uStack_6d2;
  Field local_6d0;
  Reader local_690;
  ArrayPtr<const_char> local_660;
  bool local_649;
  undefined1 local_648 [7];
  bool _kj_shouldLog_6;
  Reader local_608;
  ArrayPtr<const_char> local_5d8;
  Field local_5c8;
  uint64_t local_588;
  unsigned_long_long local_580;
  bool local_571;
  undefined1 auStack_570 [7];
  bool _kj_shouldLog_5;
  undefined8 uStack_568;
  SegmentReader *local_560;
  CapTableReader *pCStack_558;
  void *local_550;
  WirePointer *pWStack_548;
  undefined8 local_540;
  int iStack_538;
  undefined2 uStack_534;
  undefined2 uStack_532;
  Field local_530;
  Reader local_4f0;
  ArrayPtr<const_char> local_4c0;
  bool local_4a9;
  undefined1 local_4a8 [7];
  bool _kj_shouldLog_4;
  Reader local_468;
  ArrayPtr<const_char> local_438;
  Field local_428;
  uint64_t local_3e8;
  unsigned_long_long local_3e0;
  bool local_3d1;
  undefined1 auStack_3d0 [7];
  bool _kj_shouldLog_3;
  undefined8 uStack_3c8;
  SegmentReader *local_3c0;
  CapTableReader *pCStack_3b8;
  void *local_3b0;
  WirePointer *pWStack_3a8;
  undefined8 local_3a0;
  int iStack_398;
  undefined2 uStack_394;
  undefined2 uStack_392;
  Field local_390;
  Reader local_350;
  ArrayPtr<const_char> local_320;
  bool local_309;
  undefined1 local_308 [7];
  bool _kj_shouldLog_2;
  Reader local_2c8;
  ArrayPtr<const_char> local_298;
  uint local_288;
  uint local_284;
  Fault local_280;
  Fault f;
  undefined1 local_270 [8];
  FieldList barFields;
  Schema local_228;
  ParsedSchema barStruct;
  bool local_201;
  undefined1 auStack_200 [7];
  bool _kj_shouldLog_1;
  size_t local_1f8;
  uint64_t local_1f0;
  unsigned_long_long local_1e8;
  bool local_1d9;
  undefined1 local_1d8 [7];
  bool _kj_shouldLog;
  Reader barProto;
  size_t sStack_1a0;
  ArrayPtr<const_char> local_198;
  ArrayPtr<const_char> local_188;
  undefined1 local_178 [8];
  ParsedSchema barSchema;
  StringPtr importPath [3];
  ArrayPtr<const_char> local_128;
  ArrayPtr<const_char> local_118;
  ArrayPtr<const_char> local_108;
  ArrayPtr<const_char> local_f8;
  ArrayPtr<const_char> local_e8;
  ArrayPtr<const_char> local_d8;
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88 [2];
  undefined1 local_68 [8];
  SchemaParser parser;
  FakeFileReader reader;
  TestCase63 *this_local;
  
  FakeFileReader::FakeFileReader((FakeFileReader *)&parser.hadErrors);
  SchemaParser::SchemaParser((SchemaParser *)local_68);
  SchemaParser::setDiskFilesystem((SchemaParser *)local_68,(Filesystem *)&parser.hadErrors);
  kj::StringPtr::StringPtr((StringPtr *)local_88,"src/foo/bar.capnp");
  kj::StringPtr::StringPtr
            ((StringPtr *)&local_98,
             "@0x8123456789abcdef;\nstruct Bar {\n  baz @0: import \"baz.capnp\".Baz;\n  corge @1: import \"../qux/corge.capnp\".Corge;\n  grault @2: import \"/grault.capnp\".Grault;\n  garply @3: import \"/garply.capnp\".Garply;\n}\n"
            );
  FakeFileReader::add((FakeFileReader *)&parser.hadErrors,(StringPtr)local_88[0],(StringPtr)local_98
                     );
  kj::StringPtr::StringPtr((StringPtr *)&local_a8,"src/foo/baz.capnp");
  kj::StringPtr::StringPtr((StringPtr *)&local_b8,"@0x823456789abcdef1;\nstruct Baz {}\n");
  FakeFileReader::add((FakeFileReader *)&parser.hadErrors,(StringPtr)local_a8,(StringPtr)local_b8);
  kj::StringPtr::StringPtr((StringPtr *)&local_c8,"src/qux/corge.capnp");
  kj::StringPtr::StringPtr((StringPtr *)&local_d8,"@0x83456789abcdef12;\nstruct Corge {}\n");
  FakeFileReader::add((FakeFileReader *)&parser.hadErrors,(StringPtr)local_c8,(StringPtr)local_d8);
  kj::StringPtr::StringPtr((StringPtr *)&local_e8,"/usr/include/grault.capnp");
  kj::StringPtr::StringPtr((StringPtr *)&local_f8,"@0x8456789abcdef123;\nstruct Grault {}\n");
  FakeFileReader::add((FakeFileReader *)&parser.hadErrors,(StringPtr)local_e8,(StringPtr)local_f8);
  kj::StringPtr::StringPtr((StringPtr *)&local_108,"/opt/include/grault.capnp");
  kj::StringPtr::StringPtr((StringPtr *)&local_118,"@0x8000000000000001;\nstruct WrongGrault {}\n");
  FakeFileReader::add((FakeFileReader *)&parser.hadErrors,(StringPtr)local_108,(StringPtr)local_118)
  ;
  kj::StringPtr::StringPtr((StringPtr *)&local_128,"/usr/local/include/garply.capnp");
  kj::StringPtr::StringPtr
            ((StringPtr *)&importPath[2].content.size_,"@0x856789abcdef1234;\nstruct Garply {}\n");
  FakeFileReader::add((FakeFileReader *)&parser.hadErrors,(StringPtr)local_128,
                      (StringPtr)stack0xfffffffffffffec8);
  kj::StringPtr::StringPtr((StringPtr *)&barSchema.parser,"/usr/include");
  kj::StringPtr::StringPtr((StringPtr *)&importPath[0].content.size_,"/usr/local/include");
  kj::StringPtr::StringPtr((StringPtr *)&importPath[1].content.size_,"/opt/include");
  kj::StringPtr::StringPtr((StringPtr *)&local_188,"foo2/bar2.capnp");
  kj::StringPtr::StringPtr((StringPtr *)&local_198,"src/foo/bar.capnp");
  kj::ArrayPtr<kj::StringPtr_const>::ArrayPtr<3ul>
            ((ArrayPtr<kj::StringPtr_const> *)&barProto._reader.nestingLimit,
             (StringPtr (*) [3])&barSchema.parser);
  importPath_00.size_ = sStack_1a0;
  importPath_00.ptr = (StringPtr *)barProto._reader._40_8_;
  PVar4 = SchemaParser::parseDiskFile
                    ((SchemaParser *)local_68,(StringPtr)local_188,(StringPtr)local_198,
                     importPath_00);
  barSchema.super_Schema.raw = (RawBrandedSchema *)PVar4.parser;
  local_178 = (undefined1  [8])PVar4.super_Schema.raw;
  Schema::getProto((Reader *)local_1d8,(Schema *)local_178);
  uVar3 = capnp::schema::Node::Reader::getId((Reader *)local_1d8);
  if (uVar3 != 0x8123456789abcdef) {
    local_1d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d9 != false) {
      local_1e8 = 0x8123456789abcdef;
      local_1f0 = capnp::schema::Node::Reader::getId((Reader *)local_1d8);
      kj::_::Debug::log<char_const(&)[63],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,100,ERROR,
                 "\"failed: expected \" \"(0x8123456789abcdefull) == (barProto.getId())\", 0x8123456789abcdefull, barProto.getId()"
                 ,(char (*) [63])"failed: expected (0x8123456789abcdefull) == (barProto.getId())",
                 &local_1e8,&local_1f0);
      local_1d9 = false;
    }
  }
  _auStack_200 = (ArrayPtr<const_char>)
                 capnp::schema::Node::Reader::getDisplayName((Reader *)local_1d8);
  bVar1 = kj::operator==("foo2/bar2.capnp",(StringPtr *)auStack_200);
  if (!bVar1) {
    local_201 = kj::_::Debug::shouldLog(ERROR);
    while (local_201 != false) {
      RVar5 = capnp::schema::Node::Reader::getDisplayName((Reader *)local_1d8);
      barStruct.parser = RVar5.super_StringPtr.content.ptr;
      kj::_::Debug::log<char_const(&)[68],char_const(&)[16],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x65,ERROR,
                 "\"failed: expected \" \"(\\\"foo2/bar2.capnp\\\") == (barProto.getDisplayName())\", \"foo2/bar2.capnp\", barProto.getDisplayName()"
                 ,(char (*) [68])
                  "failed: expected (\"foo2/bar2.capnp\") == (barProto.getDisplayName())",
                 (char (*) [16])"foo2/bar2.capnp",(Reader *)&barStruct.parser);
      local_201 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&barFields.list.reader.nestingLimit,"Bar");
  PVar4 = ParsedSchema::getNested((ParsedSchema *)local_178,(StringPtr)stack0xfffffffffffffdc8);
  barStruct.super_Schema.raw = (RawBrandedSchema *)PVar4.parser;
  local_228 = PVar4.super_Schema.raw;
  f.exception = (Exception *)Schema::asStruct(&local_228);
  StructSchema::getFields((FieldList *)local_270,(StructSchema *)&f);
  uVar2 = StructSchema::FieldList::size((FieldList *)local_270);
  if (uVar2 != 4) {
    local_284 = 4;
    local_288 = StructSchema::FieldList::size((FieldList *)local_270);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_280,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x69,FAILED,"(4u) == (barFields.size())","4u, barFields.size()",&local_284,
               &local_288);
    kj::_::Debug::Fault::fatal(&local_280);
  }
  StructSchema::FieldList::operator[]((Field *)local_308,(FieldList *)local_270,0);
  StructSchema::Field::getProto(&local_2c8,(Field *)local_308);
  local_298 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_2c8);
  bVar1 = kj::operator==("baz",(StringPtr *)&local_298);
  if (!bVar1) {
    local_309 = kj::_::Debug::shouldLog(ERROR);
    while (local_309 != false) {
      StructSchema::FieldList::operator[](&local_390,(FieldList *)local_270,0);
      StructSchema::Field::getProto(&local_350,&local_390);
      AVar6 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_350);
      local_320 = AVar6;
      kj::_::Debug::log<char_const(&)[64],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x6a,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (barFields[0].getProto().getName())\", \"baz\", barFields[0].getProto().getName()"
                 ,(char (*) [64])"failed: expected (\"baz\") == (barFields[0].getProto().getName())"
                 ,(char (*) [4])0xa6d182,(Reader *)&local_320);
      local_309 = false;
    }
  }
  StructSchema::FieldList::operator[]((Field *)auStack_3d0,(FieldList *)local_270,0);
  field._8_8_ = local_3c0;
  field.parent.super_Schema.raw = (Schema)(Schema)uStack_3c8;
  field.proto._reader.segment = (SegmentReader *)pCStack_3b8;
  field.proto._reader.capTable = (CapTableReader *)local_3b0;
  field.proto._reader.data = pWStack_3a8;
  field.proto._reader.pointers = (WirePointer *)local_3a0;
  field.proto._reader.dataSize = iStack_398;
  field.proto._reader.pointerCount = uStack_394;
  field.proto._reader._38_2_ = uStack_392;
  field.proto._reader._40_8_ = in_stack_ffffffffffffeca8;
  uVar3 = getFieldTypeFileId(field);
  if (uVar3 != 0x823456789abcdef1) {
    local_3d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3d1 != false) {
      local_3e0 = 0x823456789abcdef1;
      StructSchema::FieldList::operator[](&local_428,(FieldList *)local_270,0);
      field_00._8_8_ = local_428.proto._reader.segment;
      field_00.parent.super_Schema.raw = (Schema)(Schema)local_428._8_8_;
      field_00.proto._reader.segment = (SegmentReader *)local_428.proto._reader.capTable;
      field_00.proto._reader.capTable = (CapTableReader *)local_428.proto._reader.data;
      field_00.proto._reader.data = local_428.proto._reader.pointers;
      field_00.proto._reader.pointers = (WirePointer *)local_428.proto._reader._32_8_;
      field_00.proto._reader.dataSize = local_428.proto._reader.nestingLimit;
      field_00.proto._reader.pointerCount = local_428.proto._reader._44_2_;
      field_00.proto._reader._38_2_ = local_428.proto._reader._46_2_;
      field_00.proto._reader._40_8_ = in_stack_ffffffffffffeca8;
      local_3e8 = getFieldTypeFileId(field_00);
      kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x6b,ERROR,
                 "\"failed: expected \" \"(0x823456789abcdef1ull) == (getFieldTypeFileId(barFields[0]))\", 0x823456789abcdef1ull, getFieldTypeFileId(barFields[0])"
                 ,(char (*) [79])
                  "failed: expected (0x823456789abcdef1ull) == (getFieldTypeFileId(barFields[0]))",
                 &local_3e0,&local_3e8);
      local_3d1 = false;
    }
  }
  StructSchema::FieldList::operator[]((Field *)local_4a8,(FieldList *)local_270,1);
  StructSchema::Field::getProto(&local_468,(Field *)local_4a8);
  local_438 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_468);
  bVar1 = kj::operator==("corge",(StringPtr *)&local_438);
  if (!bVar1) {
    local_4a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4a9 != false) {
      StructSchema::FieldList::operator[](&local_530,(FieldList *)local_270,1);
      StructSchema::Field::getProto(&local_4f0,&local_530);
      AVar6 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_4f0);
      local_4c0 = AVar6;
      kj::_::Debug::log<char_const(&)[66],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x6c,ERROR,
                 "\"failed: expected \" \"(\\\"corge\\\") == (barFields[1].getProto().getName())\", \"corge\", barFields[1].getProto().getName()"
                 ,(char (*) [66])
                  "failed: expected (\"corge\") == (barFields[1].getProto().getName())",
                 (char (*) [6])"corge",(Reader *)&local_4c0);
      local_4a9 = false;
    }
  }
  StructSchema::FieldList::operator[]((Field *)auStack_570,(FieldList *)local_270,1);
  field_01._8_8_ = local_560;
  field_01.parent.super_Schema.raw = (Schema)(Schema)uStack_568;
  field_01.proto._reader.segment = (SegmentReader *)pCStack_558;
  field_01.proto._reader.capTable = (CapTableReader *)local_550;
  field_01.proto._reader.data = pWStack_548;
  field_01.proto._reader.pointers = (WirePointer *)local_540;
  field_01.proto._reader.dataSize = iStack_538;
  field_01.proto._reader.pointerCount = uStack_534;
  field_01.proto._reader._38_2_ = uStack_532;
  field_01.proto._reader._40_8_ = in_stack_ffffffffffffeca8;
  uVar3 = getFieldTypeFileId(field_01);
  if (uVar3 != 0x83456789abcdef12) {
    local_571 = kj::_::Debug::shouldLog(ERROR);
    while (local_571 != false) {
      local_580 = 0x83456789abcdef12;
      StructSchema::FieldList::operator[](&local_5c8,(FieldList *)local_270,1);
      field_02._8_8_ = local_5c8.proto._reader.segment;
      field_02.parent.super_Schema.raw = (Schema)(Schema)local_5c8._8_8_;
      field_02.proto._reader.segment = (SegmentReader *)local_5c8.proto._reader.capTable;
      field_02.proto._reader.capTable = (CapTableReader *)local_5c8.proto._reader.data;
      field_02.proto._reader.data = local_5c8.proto._reader.pointers;
      field_02.proto._reader.pointers = (WirePointer *)local_5c8.proto._reader._32_8_;
      field_02.proto._reader.dataSize = local_5c8.proto._reader.nestingLimit;
      field_02.proto._reader.pointerCount = local_5c8.proto._reader._44_2_;
      field_02.proto._reader._38_2_ = local_5c8.proto._reader._46_2_;
      field_02.proto._reader._40_8_ = in_stack_ffffffffffffeca8;
      local_588 = getFieldTypeFileId(field_02);
      kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x6d,ERROR,
                 "\"failed: expected \" \"(0x83456789abcdef12ull) == (getFieldTypeFileId(barFields[1]))\", 0x83456789abcdef12ull, getFieldTypeFileId(barFields[1])"
                 ,(char (*) [79])
                  "failed: expected (0x83456789abcdef12ull) == (getFieldTypeFileId(barFields[1]))",
                 &local_580,&local_588);
      local_571 = false;
    }
  }
  StructSchema::FieldList::operator[]((Field *)local_648,(FieldList *)local_270,2);
  StructSchema::Field::getProto(&local_608,(Field *)local_648);
  local_5d8 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_608);
  bVar1 = kj::operator==("grault",(StringPtr *)&local_5d8);
  if (!bVar1) {
    local_649 = kj::_::Debug::shouldLog(ERROR);
    while (local_649 != false) {
      StructSchema::FieldList::operator[](&local_6d0,(FieldList *)local_270,2);
      StructSchema::Field::getProto(&local_690,&local_6d0);
      AVar6 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_690);
      local_660 = AVar6;
      kj::_::Debug::log<char_const(&)[67],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x6e,ERROR,
                 "\"failed: expected \" \"(\\\"grault\\\") == (barFields[2].getProto().getName())\", \"grault\", barFields[2].getProto().getName()"
                 ,(char (*) [67])
                  "failed: expected (\"grault\") == (barFields[2].getProto().getName())",
                 (char (*) [7])"grault",(Reader *)&local_660);
      local_649 = false;
    }
  }
  StructSchema::FieldList::operator[]((Field *)auStack_710,(FieldList *)local_270,2);
  field_03._8_8_ = local_700;
  field_03.parent.super_Schema.raw = (Schema)(Schema)uStack_708;
  field_03.proto._reader.segment = (SegmentReader *)pCStack_6f8;
  field_03.proto._reader.capTable = (CapTableReader *)local_6f0;
  field_03.proto._reader.data = pWStack_6e8;
  field_03.proto._reader.pointers = (WirePointer *)local_6e0;
  field_03.proto._reader.dataSize = iStack_6d8;
  field_03.proto._reader.pointerCount = uStack_6d4;
  field_03.proto._reader._38_2_ = uStack_6d2;
  field_03.proto._reader._40_8_ = in_stack_ffffffffffffeca8;
  uVar3 = getFieldTypeFileId(field_03);
  if (uVar3 != 0x8456789abcdef123) {
    local_711 = kj::_::Debug::shouldLog(ERROR);
    while (local_711 != false) {
      local_720 = 0x8456789abcdef123;
      StructSchema::FieldList::operator[](&local_768,(FieldList *)local_270,2);
      field_04._8_8_ = local_768.proto._reader.segment;
      field_04.parent.super_Schema.raw = (Schema)(Schema)local_768._8_8_;
      field_04.proto._reader.segment = (SegmentReader *)local_768.proto._reader.capTable;
      field_04.proto._reader.capTable = (CapTableReader *)local_768.proto._reader.data;
      field_04.proto._reader.data = local_768.proto._reader.pointers;
      field_04.proto._reader.pointers = (WirePointer *)local_768.proto._reader._32_8_;
      field_04.proto._reader.dataSize = local_768.proto._reader.nestingLimit;
      field_04.proto._reader.pointerCount = local_768.proto._reader._44_2_;
      field_04.proto._reader._38_2_ = local_768.proto._reader._46_2_;
      field_04.proto._reader._40_8_ = in_stack_ffffffffffffeca8;
      local_728 = getFieldTypeFileId(field_04);
      kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x6f,ERROR,
                 "\"failed: expected \" \"(0x8456789abcdef123ull) == (getFieldTypeFileId(barFields[2]))\", 0x8456789abcdef123ull, getFieldTypeFileId(barFields[2])"
                 ,(char (*) [79])
                  "failed: expected (0x8456789abcdef123ull) == (getFieldTypeFileId(barFields[2]))",
                 &local_720,&local_728);
      local_711 = false;
    }
  }
  StructSchema::FieldList::operator[]((Field *)local_7e8,(FieldList *)local_270,3);
  StructSchema::Field::getProto(&local_7a8,(Field *)local_7e8);
  local_778 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_7a8);
  bVar1 = kj::operator==("garply",(StringPtr *)&local_778);
  if (!bVar1) {
    local_7e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_7e9 != false) {
      StructSchema::FieldList::operator[](&local_870,(FieldList *)local_270,3);
      StructSchema::Field::getProto(&local_830,&local_870);
      AVar6 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_830);
      local_800 = AVar6;
      kj::_::Debug::log<char_const(&)[67],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x70,ERROR,
                 "\"failed: expected \" \"(\\\"garply\\\") == (barFields[3].getProto().getName())\", \"garply\", barFields[3].getProto().getName()"
                 ,(char (*) [67])
                  "failed: expected (\"garply\") == (barFields[3].getProto().getName())",
                 (char (*) [7])0xa571da,(Reader *)&local_800);
      local_7e9 = false;
    }
  }
  StructSchema::FieldList::operator[]((Field *)auStack_8b0,(FieldList *)local_270,3);
  field_05._8_8_ = local_8a0;
  field_05.parent.super_Schema.raw = (Schema)(Schema)uStack_8a8;
  field_05.proto._reader.segment = (SegmentReader *)pCStack_898;
  field_05.proto._reader.capTable = (CapTableReader *)local_890;
  field_05.proto._reader.data = pWStack_888;
  field_05.proto._reader.pointers = (WirePointer *)local_880;
  field_05.proto._reader.dataSize = iStack_878;
  field_05.proto._reader.pointerCount = uStack_874;
  field_05.proto._reader._38_2_ = uStack_872;
  field_05.proto._reader._40_8_ = in_stack_ffffffffffffeca8;
  uVar3 = getFieldTypeFileId(field_05);
  if (uVar3 != 0x856789abcdef1234) {
    local_8b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_8b1 != false) {
      local_8c0 = 0x856789abcdef1234;
      StructSchema::FieldList::operator[]((Field *)&bazSchema.parser,(FieldList *)local_270,3);
      field_06._8_8_ = local_8f8;
      field_06.parent.super_Schema.raw = (Schema)(Schema)uStack_900;
      field_06.proto._reader.segment = (SegmentReader *)uStack_8f0;
      field_06.proto._reader.capTable = (CapTableReader *)local_8e8;
      field_06.proto._reader.data = (void *)uStack_8e0;
      field_06.proto._reader.pointers = (WirePointer *)local_8d8;
      field_06.proto._reader._32_8_ = uStack_8d0;
      field_06.proto._reader._40_8_ = in_stack_ffffffffffffeca8;
      local_8c8 = getFieldTypeFileId(field_06);
      kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x71,ERROR,
                 "\"failed: expected \" \"(0x856789abcdef1234ull) == (getFieldTypeFileId(barFields[3]))\", 0x856789abcdef1234ull, getFieldTypeFileId(barFields[3])"
                 ,(char (*) [79])
                  "failed: expected (0x856789abcdef1234ull) == (getFieldTypeFileId(barFields[3]))",
                 &local_8c0,&local_8c8);
      local_8b1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_928,"not/used/because/already/loaded");
  kj::StringPtr::StringPtr((StringPtr *)&local_938,"src/foo/baz.capnp");
  kj::ArrayPtr<kj::StringPtr_const>::ArrayPtr<3ul>
            ((ArrayPtr<kj::StringPtr_const> *)&local_948,(StringPtr (*) [3])&barSchema.parser);
  importPath_01.size_ = sStack_940;
  importPath_01.ptr = local_948;
  PVar4 = SchemaParser::parseDiskFile
                    ((SchemaParser *)local_68,(StringPtr)local_928,(StringPtr)local_938,
                     importPath_01);
  bazSchema.super_Schema.raw = (RawBrandedSchema *)PVar4.parser;
  local_918 = (undefined1  [8])PVar4.super_Schema.raw;
  Schema::getProto((Reader *)local_978,(Schema *)local_918);
  uVar3 = capnp::schema::Node::Reader::getId((Reader *)local_978);
  if (uVar3 != 0x823456789abcdef1) {
    local_979 = kj::_::Debug::shouldLog(ERROR);
    while (local_979 != false) {
      local_988 = 0x823456789abcdef1;
      Schema::getProto(&local_9c0,(Schema *)local_918);
      local_990 = capnp::schema::Node::Reader::getId(&local_9c0);
      kj::_::Debug::log<char_const(&)[75],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x76,ERROR,
                 "\"failed: expected \" \"(0x823456789abcdef1ull) == (bazSchema.getProto().getId())\", 0x823456789abcdef1ull, bazSchema.getProto().getId()"
                 ,(char (*) [75])
                  "failed: expected (0x823456789abcdef1ull) == (bazSchema.getProto().getId())",
                 &local_988,&local_990);
      local_979 = false;
    }
  }
  Schema::getProto((Reader *)local_a00,(Schema *)local_918);
  local_9d0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)local_a00)
  ;
  bVar1 = kj::operator==("foo2/baz.capnp",(StringPtr *)&local_9d0);
  if (!bVar1) {
    local_a01 = kj::_::Debug::shouldLog(ERROR);
    while (local_a01 != false) {
      Schema::getProto((Reader *)&bazStruct,(Schema *)local_918);
      AVar6 = (ArrayPtr<const_char>)
              capnp::schema::Node::Reader::getDisplayName((Reader *)&bazStruct);
      local_a18 = AVar6;
      kj::_::Debug::log<char_const(&)[79],char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x77,ERROR,
                 "\"failed: expected \" \"(\\\"foo2/baz.capnp\\\") == (bazSchema.getProto().getDisplayName())\", \"foo2/baz.capnp\", bazSchema.getProto().getDisplayName()"
                 ,(char (*) [79])
                  "failed: expected (\"foo2/baz.capnp\") == (bazSchema.getProto().getDisplayName())"
                 ,(char (*) [15])"foo2/baz.capnp",(Reader *)&local_a18);
      local_a01 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_a70,"Baz");
  local_a60 = ParsedSchema::getNested((ParsedSchema *)local_918,(StringPtr)local_a70);
  local_a50.raw = (RawBrandedSchema *)Schema::asStruct(&local_a60.super_Schema);
  Schema::getProto((Reader *)local_aa8,&local_a50);
  uVar3 = capnp::schema::Node::Reader::getId((Reader *)local_aa8);
  local_a78 = Schema::getDependency(&local_228,uVar3);
  bVar1 = Schema::operator==(&local_a50,&local_a78);
  if (!bVar1) {
    local_aa9 = kj::_::Debug::shouldLog(ERROR);
    while (local_aa9 != false) {
      Schema::getProto((Reader *)&corgeSchema.parser,&local_a50);
      uVar3 = capnp::schema::Node::Reader::getId((Reader *)&corgeSchema.parser);
      local_ab8 = Schema::getDependency(&local_228,uVar3);
      kj::_::Debug::log<char_const(&)[88],capnp::StructSchema&,capnp::Schema>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x79,ERROR,
                 "\"failed: expected \" \"(bazStruct) == (barStruct.getDependency(bazStruct.getProto().getId()))\", bazStruct, barStruct.getDependency(bazStruct.getProto().getId())"
                 ,(char (*) [88])
                  "failed: expected (bazStruct) == (barStruct.getDependency(bazStruct.getProto().getId()))"
                 ,(StructSchema *)&local_a50,&local_ab8);
      local_aa9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_b08,"not/used/because/already/loaded");
  kj::StringPtr::StringPtr((StringPtr *)&local_b18,"src/qux/corge.capnp");
  kj::ArrayPtr<kj::StringPtr_const>::ArrayPtr<3ul>
            ((ArrayPtr<kj::StringPtr_const> *)&local_b28,(StringPtr (*) [3])&barSchema.parser);
  importPath_02.size_ = sStack_b20;
  importPath_02.ptr = local_b28;
  PVar4 = SchemaParser::parseDiskFile
                    ((SchemaParser *)local_68,(StringPtr)local_b08,(StringPtr)local_b18,
                     importPath_02);
  corgeSchema.super_Schema.raw = (RawBrandedSchema *)PVar4.parser;
  local_af8 = (undefined1  [8])PVar4.super_Schema.raw;
  Schema::getProto((Reader *)local_b58,(Schema *)local_af8);
  uVar3 = capnp::schema::Node::Reader::getId((Reader *)local_b58);
  if (uVar3 != 0x83456789abcdef12) {
    local_b59 = kj::_::Debug::shouldLog(ERROR);
    while (local_b59 != false) {
      local_b68 = 0x83456789abcdef12;
      Schema::getProto(&local_ba0,(Schema *)local_af8);
      local_b70 = capnp::schema::Node::Reader::getId(&local_ba0);
      kj::_::Debug::log<char_const(&)[77],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x7e,ERROR,
                 "\"failed: expected \" \"(0x83456789abcdef12ull) == (corgeSchema.getProto().getId())\", 0x83456789abcdef12ull, corgeSchema.getProto().getId()"
                 ,(char (*) [77])
                  "failed: expected (0x83456789abcdef12ull) == (corgeSchema.getProto().getId())",
                 &local_b68,&local_b70);
      local_b59 = false;
    }
  }
  Schema::getProto((Reader *)local_be0,(Schema *)local_af8);
  local_bb0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)local_be0)
  ;
  bVar1 = kj::operator==("qux/corge.capnp",(StringPtr *)&local_bb0);
  if (!bVar1) {
    local_be1 = kj::_::Debug::shouldLog(ERROR);
    while (local_be1 != false) {
      Schema::getProto((Reader *)&corgeStruct,(Schema *)local_af8);
      AVar6 = (ArrayPtr<const_char>)
              capnp::schema::Node::Reader::getDisplayName((Reader *)&corgeStruct);
      local_bf8 = AVar6;
      kj::_::Debug::log<char_const(&)[82],char_const(&)[16],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x7f,ERROR,
                 "\"failed: expected \" \"(\\\"qux/corge.capnp\\\") == (corgeSchema.getProto().getDisplayName())\", \"qux/corge.capnp\", corgeSchema.getProto().getDisplayName()"
                 ,(char (*) [82])
                  "failed: expected (\"qux/corge.capnp\") == (corgeSchema.getProto().getDisplayName())"
                 ,(char (*) [16])0xa2fcc2,(Reader *)&local_bf8);
      local_be1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_c50,"Corge");
  local_c40 = ParsedSchema::getNested((ParsedSchema *)local_af8,(StringPtr)local_c50);
  local_c30.raw = (RawBrandedSchema *)Schema::asStruct(&local_c40.super_Schema);
  Schema::getProto((Reader *)local_c88,&local_c30);
  uVar3 = capnp::schema::Node::Reader::getId((Reader *)local_c88);
  local_c58 = Schema::getDependency(&local_228,uVar3);
  bVar1 = Schema::operator==(&local_c30,&local_c58);
  if (!bVar1) {
    local_c89 = kj::_::Debug::shouldLog(ERROR);
    while (local_c89 != false) {
      Schema::getProto((Reader *)&graultSchema.parser,&local_c30);
      uVar3 = capnp::schema::Node::Reader::getId((Reader *)&graultSchema.parser);
      local_c98 = Schema::getDependency(&local_228,uVar3);
      kj::_::Debug::log<char_const(&)[92],capnp::StructSchema&,capnp::Schema>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x81,ERROR,
                 "\"failed: expected \" \"(corgeStruct) == (barStruct.getDependency(corgeStruct.getProto().getId()))\", corgeStruct, barStruct.getDependency(corgeStruct.getProto().getId())"
                 ,(char (*) [92])
                  "failed: expected (corgeStruct) == (barStruct.getDependency(corgeStruct.getProto().getId()))"
                 ,(StructSchema *)&local_c30,&local_c98);
      local_c89 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_ce8,"not/used/because/already/loaded");
  kj::StringPtr::StringPtr((StringPtr *)&local_cf8,"/usr/include/grault.capnp");
  kj::ArrayPtr<kj::StringPtr_const>::ArrayPtr<3ul>
            ((ArrayPtr<kj::StringPtr_const> *)&local_d08,(StringPtr (*) [3])&barSchema.parser);
  importPath_03.size_ = sStack_d00;
  importPath_03.ptr = local_d08;
  PVar4 = SchemaParser::parseDiskFile
                    ((SchemaParser *)local_68,(StringPtr)local_ce8,(StringPtr)local_cf8,
                     importPath_03);
  graultSchema.super_Schema.raw = (RawBrandedSchema *)PVar4.parser;
  local_cd8 = (undefined1  [8])PVar4.super_Schema.raw;
  Schema::getProto((Reader *)local_d38,(Schema *)local_cd8);
  uVar3 = capnp::schema::Node::Reader::getId((Reader *)local_d38);
  if (uVar3 != 0x8456789abcdef123) {
    local_d39 = kj::_::Debug::shouldLog(ERROR);
    while (local_d39 != false) {
      local_d48 = 0x8456789abcdef123;
      Schema::getProto(&local_d80,(Schema *)local_cd8);
      local_d50 = capnp::schema::Node::Reader::getId(&local_d80);
      kj::_::Debug::log<char_const(&)[78],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x86,ERROR,
                 "\"failed: expected \" \"(0x8456789abcdef123ull) == (graultSchema.getProto().getId())\", 0x8456789abcdef123ull, graultSchema.getProto().getId()"
                 ,(char (*) [78])
                  "failed: expected (0x8456789abcdef123ull) == (graultSchema.getProto().getId())",
                 &local_d48,&local_d50);
      local_d39 = false;
    }
  }
  Schema::getProto((Reader *)local_dc0,(Schema *)local_cd8);
  local_d90 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)local_dc0)
  ;
  bVar1 = kj::operator==("grault.capnp",(StringPtr *)&local_d90);
  if (!bVar1) {
    local_dc1 = kj::_::Debug::shouldLog(ERROR);
    while (local_dc1 != false) {
      Schema::getProto((Reader *)&graultStruct,(Schema *)local_cd8);
      AVar6 = (ArrayPtr<const_char>)
              capnp::schema::Node::Reader::getDisplayName((Reader *)&graultStruct);
      local_dd8 = AVar6;
      kj::_::Debug::log<char_const(&)[80],char_const(&)[13],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x87,ERROR,
                 "\"failed: expected \" \"(\\\"grault.capnp\\\") == (graultSchema.getProto().getDisplayName())\", \"grault.capnp\", graultSchema.getProto().getDisplayName()"
                 ,(char (*) [80])
                  "failed: expected (\"grault.capnp\") == (graultSchema.getProto().getDisplayName())"
                 ,(char (*) [13])0xa2fd05,(Reader *)&local_dd8);
      local_dc1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_e30,"Grault");
  local_e20 = ParsedSchema::getNested((ParsedSchema *)local_cd8,(StringPtr)local_e30);
  local_e10.raw = (RawBrandedSchema *)Schema::asStruct(&local_e20.super_Schema);
  Schema::getProto((Reader *)local_e68,&local_e10);
  uVar3 = capnp::schema::Node::Reader::getId((Reader *)local_e68);
  local_e38 = Schema::getDependency(&local_228,uVar3);
  bVar1 = Schema::operator==(&local_e10,&local_e38);
  if (!bVar1) {
    local_e69 = kj::_::Debug::shouldLog(ERROR);
    while (local_e69 != false) {
      Schema::getProto((Reader *)&wrongGraultSchema.parser,&local_e10);
      uVar3 = capnp::schema::Node::Reader::getId((Reader *)&wrongGraultSchema.parser);
      local_e78 = Schema::getDependency(&local_228,uVar3);
      kj::_::Debug::log<char_const(&)[94],capnp::StructSchema&,capnp::Schema>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x89,ERROR,
                 "\"failed: expected \" \"(graultStruct) == (barStruct.getDependency(graultStruct.getProto().getId()))\", graultStruct, barStruct.getDependency(graultStruct.getProto().getId())"
                 ,(char (*) [94])
                  "failed: expected (graultStruct) == (barStruct.getDependency(graultStruct.getProto().getId()))"
                 ,(StructSchema *)&local_e10,&local_e78);
      local_e69 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_ec8,"weird/display/name.capnp");
  kj::StringPtr::StringPtr((StringPtr *)&local_ed8,"/opt/include/grault.capnp");
  kj::ArrayPtr<kj::StringPtr_const>::ArrayPtr<3ul>
            ((ArrayPtr<kj::StringPtr_const> *)&local_ee8,(StringPtr (*) [3])&barSchema.parser);
  importPath_04.size_ = sStack_ee0;
  importPath_04.ptr = local_ee8;
  PVar4 = SchemaParser::parseDiskFile
                    ((SchemaParser *)local_68,(StringPtr)local_ec8,(StringPtr)local_ed8,
                     importPath_04);
  wrongGraultSchema.super_Schema.raw = (RawBrandedSchema *)PVar4.parser;
  local_eb8 = PVar4.super_Schema.raw;
  Schema::getProto((Reader *)local_f18,&local_eb8);
  uVar3 = capnp::schema::Node::Reader::getId((Reader *)local_f18);
  if (uVar3 != 0x8000000000000001) {
    local_f19 = kj::_::Debug::shouldLog(ERROR);
    while (local_f19 != false) {
      local_f28 = 0x8000000000000001;
      Schema::getProto(&local_f60,&local_eb8);
      local_f30 = capnp::schema::Node::Reader::getId(&local_f60);
      kj::_::Debug::log<char_const(&)[83],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x90,ERROR,
                 "\"failed: expected \" \"(0x8000000000000001ull) == (wrongGraultSchema.getProto().getId())\", 0x8000000000000001ull, wrongGraultSchema.getProto().getId()"
                 ,(char (*) [83])
                  "failed: expected (0x8000000000000001ull) == (wrongGraultSchema.getProto().getId())"
                 ,&local_f28,&local_f30);
      local_f19 = false;
    }
  }
  Schema::getProto((Reader *)local_fa0,&local_eb8);
  local_f70 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)local_fa0)
  ;
  bVar1 = kj::operator==("weird/display/name.capnp",(StringPtr *)&local_f70);
  if (!bVar1) {
    local_fa1 = kj::_::Debug::shouldLog(ERROR);
    while (local_fa1 != false) {
      Schema::getProto(&local_fe8,&local_eb8);
      AVar6 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_fe8);
      local_fb8 = AVar6;
      kj::_::Debug::log<char_const(&)[97],char_const(&)[25],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x91,ERROR,
                 "\"failed: expected \" \"(\\\"weird/display/name.capnp\\\") == (wrongGraultSchema.getProto().getDisplayName())\", \"weird/display/name.capnp\", wrongGraultSchema.getProto().getDisplayName()"
                 ,(char (*) [97])
                  "failed: expected (\"weird/display/name.capnp\") == (wrongGraultSchema.getProto().getDisplayName())"
                 ,(char (*) [25])"weird/display/name.capnp",(Reader *)&local_fb8);
      local_fa1 = false;
    }
  }
  SchemaParser::~SchemaParser((SchemaParser *)local_68);
  FakeFileReader::~FakeFileReader((FakeFileReader *)&parser.hadErrors);
  return;
}

Assistant:

TEST(SchemaParser, Basic) {
  FakeFileReader reader;
  SchemaParser parser;
  parser.setDiskFilesystem(reader);

  reader.add("src/foo/bar.capnp",
      "@0x8123456789abcdef;\n"
      "struct Bar {\n"
      "  baz @0: import \"baz.capnp\".Baz;\n"
      "  corge @1: import \"../qux/corge.capnp\".Corge;\n"
      "  grault @2: import \"/grault.capnp\".Grault;\n"
      "  garply @3: import \"/garply.capnp\".Garply;\n"
      "}\n");
  reader.add("src/foo/baz.capnp",
      "@0x823456789abcdef1;\n"
      "struct Baz {}\n");
  reader.add("src/qux/corge.capnp",
      "@0x83456789abcdef12;\n"
      "struct Corge {}\n");
  reader.add(ABS("usr/include/grault.capnp"),
      "@0x8456789abcdef123;\n"
      "struct Grault {}\n");
  reader.add(ABS("opt/include/grault.capnp"),
      "@0x8000000000000001;\n"
      "struct WrongGrault {}\n");
  reader.add(ABS("usr/local/include/garply.capnp"),
      "@0x856789abcdef1234;\n"
      "struct Garply {}\n");

  kj::StringPtr importPath[] = {
    ABS("usr/include"), ABS("usr/local/include"), ABS("opt/include")
  };

  ParsedSchema barSchema = parser.parseDiskFile(
      "foo2/bar2.capnp", "src/foo/bar.capnp", importPath);

  auto barProto = barSchema.getProto();
  EXPECT_EQ(0x8123456789abcdefull, barProto.getId());
  EXPECT_EQ("foo2/bar2.capnp", barProto.getDisplayName());

  auto barStruct = barSchema.getNested("Bar");
  auto barFields = barStruct.asStruct().getFields();
  ASSERT_EQ(4u, barFields.size());
  EXPECT_EQ("baz", barFields[0].getProto().getName());
  EXPECT_EQ(0x823456789abcdef1ull, getFieldTypeFileId(barFields[0]));
  EXPECT_EQ("corge", barFields[1].getProto().getName());
  EXPECT_EQ(0x83456789abcdef12ull, getFieldTypeFileId(barFields[1]));
  EXPECT_EQ("grault", barFields[2].getProto().getName());
  EXPECT_EQ(0x8456789abcdef123ull, getFieldTypeFileId(barFields[2]));
  EXPECT_EQ("garply", barFields[3].getProto().getName());
  EXPECT_EQ(0x856789abcdef1234ull, getFieldTypeFileId(barFields[3]));

  auto bazSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      "src/foo/baz.capnp", importPath);
  EXPECT_EQ(0x823456789abcdef1ull, bazSchema.getProto().getId());
  EXPECT_EQ("foo2/baz.capnp", bazSchema.getProto().getDisplayName());
  auto bazStruct = bazSchema.getNested("Baz").asStruct();
  EXPECT_EQ(bazStruct, barStruct.getDependency(bazStruct.getProto().getId()));

  auto corgeSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      "src/qux/corge.capnp", importPath);
  EXPECT_EQ(0x83456789abcdef12ull, corgeSchema.getProto().getId());
  EXPECT_EQ("qux/corge.capnp", corgeSchema.getProto().getDisplayName());
  auto corgeStruct = corgeSchema.getNested("Corge").asStruct();
  EXPECT_EQ(corgeStruct, barStruct.getDependency(corgeStruct.getProto().getId()));

  auto graultSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      ABS("usr/include/grault.capnp"), importPath);
  EXPECT_EQ(0x8456789abcdef123ull, graultSchema.getProto().getId());
  EXPECT_EQ("grault.capnp", graultSchema.getProto().getDisplayName());
  auto graultStruct = graultSchema.getNested("Grault").asStruct();
  EXPECT_EQ(graultStruct, barStruct.getDependency(graultStruct.getProto().getId()));

  // Try importing the other grault.capnp directly.  It'll get the display name we specify since
  // it wasn't imported before.
  auto wrongGraultSchema = parser.parseDiskFile(
      "weird/display/name.capnp",
      ABS("opt/include/grault.capnp"), importPath);
  EXPECT_EQ(0x8000000000000001ull, wrongGraultSchema.getProto().getId());
  EXPECT_EQ("weird/display/name.capnp", wrongGraultSchema.getProto().getDisplayName());
}